

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_pax.c
# Opt level: O0

int archive_write_pax_finish_entry(archive_write *a)

{
  long *plVar1;
  long lVar2;
  int iVar3;
  sparse_block_conflict *sb;
  long lStack_20;
  int ret;
  uint64_t remaining;
  pax *pax;
  archive_write *a_local;
  
  plVar1 = (long *)a->format_data;
  lStack_20 = *plVar1;
  if (lStack_20 == 0) {
    while (plVar1[0xc] != 0) {
      if (*(int *)(plVar1[0xc] + 8) == 0) {
        lStack_20 = *(long *)(plVar1[0xc] + 0x18) + lStack_20;
      }
      lVar2 = *(long *)plVar1[0xc];
      free((void *)plVar1[0xc]);
      plVar1[0xc] = lVar2;
    }
  }
  iVar3 = __archive_write_nulls(a,lStack_20 + plVar1[1]);
  plVar1[1] = 0;
  *plVar1 = 0;
  return iVar3;
}

Assistant:

static int
archive_write_pax_finish_entry(struct archive_write *a)
{
	struct pax *pax;
	uint64_t remaining;
	int ret;

	pax = (struct pax *)a->format_data;
	remaining = pax->entry_bytes_remaining;
	if (remaining == 0) {
		while (pax->sparse_list) {
			struct sparse_block *sb;
			if (!pax->sparse_list->is_hole)
				remaining += pax->sparse_list->remaining;
			sb = pax->sparse_list->next;
			free(pax->sparse_list);
			pax->sparse_list = sb;
		}
	}
	ret = __archive_write_nulls(a, (size_t)(remaining + pax->entry_padding));
	pax->entry_bytes_remaining = pax->entry_padding = 0;
	return (ret);
}